

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_calc_hash(ptls_hash_algorithm_t *algo,void *output,void *src,size_t len)

{
  undefined8 *puVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ptls_hash_context_t *ctx;
  int local_4;
  
  puVar1 = (undefined8 *)(**(code **)(in_RDI + 0x10))();
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = 0x201;
  }
  else {
    (*(code *)*puVar1)(puVar1,in_RDX,in_RCX);
    (*(code *)puVar1[1])(puVar1,in_RSI,0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ptls_calc_hash(ptls_hash_algorithm_t *algo, void *output, const void *src, size_t len)
{
    ptls_hash_context_t *ctx;

    if ((ctx = algo->create()) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->update(ctx, src, len);
    ctx->final(ctx, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}